

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::nativeListen(QNativeSocketEnginePrivate *this,int backlog)

{
  int iVar1;
  int *piVar2;
  SocketError in_ESI;
  QNativeSocketEnginePrivate *in_RDI;
  ErrorString in_stack_ffffffffffffffe8;
  QNativeSocketEnginePrivate *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  iVar1 = qt_safe_listen(0,0x35a93d);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x62) {
      setError(this_00,in_ESI,in_stack_ffffffffffffffe8);
    }
    local_1 = false;
  }
  else {
    (in_RDI->super_QAbstractSocketEnginePrivate).socketState = ListeningState;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QNativeSocketEnginePrivate::nativeListen(int backlog)
{
    if (qt_safe_listen(socketDescriptor, backlog) < 0) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        int ecopy = errno;
#endif
        switch (errno) {
        case EADDRINUSE:
            setError(QAbstractSocket::AddressInUseError,
                     PortInuseErrorString);
            break;
        default:
            break;
        }

#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::nativeListen(%i) == false (%s)",
               backlog, strerror(ecopy));
#endif
        return false;
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeListen(%i) == true", backlog);
#endif

    socketState = QAbstractSocket::ListeningState;
    return true;
}